

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void make_write_cache(vw *all,string *newname,bool quiet)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined8 uVar4;
  long lVar5;
  version_struct *this;
  v_array<char> *v;
  byte in_DL;
  string *in_RSI;
  long in_RDI;
  size_t v_length;
  int f;
  string temp;
  io_buf *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  long *plVar6;
  v_array<char> *in_stack_fffffffffffffed0;
  string local_c8 [32];
  string local_a8 [32];
  version_struct *in_stack_ffffffffffffff78;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  long *local_20;
  byte local_11;
  string *local_10;
  long local_8;
  
  local_11 = in_DL & 1;
  local_20 = *(long **)(*(long *)(in_RDI + 8) + 0x210);
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = v_array<int>::size((v_array<int> *)(local_20 + 6));
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,".writing",&local_61);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    push_many<char>(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                    (size_t)in_stack_fffffffffffffec0);
    plVar6 = local_20;
    uVar4 = std::__cxx11::string::c_str();
    iVar1 = (**(code **)*plVar6)(plVar6,uVar4,*(byte *)(local_8 + 0x3558) & 1,2);
    if (iVar1 == -1) {
      poVar3 = std::operator<<((ostream *)(local_8 + 0xe0),"can\'t create cache file !");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      version_struct::to_string_abi_cxx11_(in_stack_ffffffffffffff78);
      lVar5 = std::__cxx11::string::length();
      this = (version_struct *)(lVar5 + 1);
      std::__cxx11::string::~string(local_a8);
      (**(code **)(*local_20 + 0x30))(local_20,iVar1,&stack0xffffffffffffff78,8);
      plVar6 = local_20;
      version_struct::to_string_abi_cxx11_(this);
      uVar4 = std::__cxx11::string::c_str();
      (**(code **)(*plVar6 + 0x30))(plVar6,iVar1,uVar4,this);
      std::__cxx11::string::~string(local_c8);
      (**(code **)(*local_20 + 0x30))(local_20,iVar1,"c",1);
      (**(code **)(*local_20 + 0x30))(local_20,iVar1,local_8 + 0x50,4);
      plVar6 = local_20 + 0x11;
      v = (v_array<char> *)std::__cxx11::string::c_str();
      std::__cxx11::string::length();
      push_many<char>(v,(char *)plVar6,(size_t)in_stack_fffffffffffffec0);
      *(undefined1 *)(*(long *)(local_8 + 8) + 0x218) = 1;
      if ((local_11 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)(local_8 + 0xe0),"creating cache_file = ");
        poVar3 = std::operator<<(poVar3,local_10);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::string::~string(local_40);
  }
  else {
    poVar3 = std::operator<<((ostream *)(local_8 + 0xe0),
                             "Warning: you tried to make two write caches.  Only the first one will be made."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void make_write_cache(vw& all, string& newname, bool quiet)
{
  io_buf* output = all.p->output;
  if (output->files.size() != 0)
  {
    all.trace_message << "Warning: you tried to make two write caches.  Only the first one will be made." << endl;
    return;
  }

  string temp = newname + string(".writing");
  push_many(output->currentname, temp.c_str(), temp.length() + 1);

  int f = output->open_file(temp.c_str(), all.stdin_off, io_buf::WRITE);
  if (f == -1)
  {
    all.trace_message << "can't create cache file !" << endl;
    return;
  }

  size_t v_length = (uint64_t)version.to_string().length() + 1;

  output->write_file(f, &v_length, sizeof(v_length));
  output->write_file(f, version.to_string().c_str(), v_length);
  output->write_file(f, "c", 1);
  output->write_file(f, &all.num_bits, sizeof(all.num_bits));

  push_many(output->finalname, newname.c_str(), newname.length() + 1);
  all.p->write_cache = true;
  if (!quiet)
    all.trace_message << "creating cache_file = " << newname << endl;
}